

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O0

void std_array(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  Assert local_1c8 [2];
  outputter<std::array<int,_4UL>_> local_1a8;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  undefined1 auStack_18 [8];
  array<int,_4UL> s;
  
  auStack_18._0_4_ = 0;
  auStack_18._4_4_ = 1;
  s._M_elems[0] = 2;
  s._M_elems[1] = 0x9c;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8 = UnitTests::stream_any<std::array<int,4ul>>((array<int,_4UL> *)auStack_18);
  UnitTests::stream_any_details::operator<<(local_190,&local_1a8);
  UnitTests::Assert::Assert
            (local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
             ,0x92);
  std::__cxx11::stringstream::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (local_1c8,(char (*) [15])"[0, 1, 2, 156]",local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

TEST(std_array)
{
    auto s  = std::array<int, 4>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}